

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O2

void __thiscall wasm::Fuzzer::checkSubtypes(Fuzzer *this)

{
  undefined1 *puVar1;
  ostream *poVar2;
  uint uVar3;
  pointer pvVar4;
  uint *puVar5;
  pointer pHVar6;
  char cVar7;
  Fatal *pFVar8;
  ulong uVar9;
  uint *puVar10;
  undefined1 local_1b8 [392];
  
  uVar9 = 0;
  do {
    if ((ulong)((long)(this->types).
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->types).
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar9) {
      return;
    }
    pvVar4 = (this->subtypeIndices).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar10 = pvVar4[uVar9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar5 = *(pointer *)
              ((long)&pvVar4[uVar9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data + 8);
    while (puVar10 != puVar5) {
      uVar3 = *puVar10;
      pHVar6 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_start;
      cVar7 = wasm::HeapType::isSubType((HeapType)pHVar6[uVar3].id,(HeapType)pHVar6[uVar9].id);
      puVar10 = puVar10 + 1;
      if (cVar7 == '\0') {
        Fatal::Fatal((Fatal *)local_1b8);
        poVar2 = (ostream *)(local_1b8 + 0x10);
        std::operator<<(poVar2,"HeapType ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2," should be a subtype of HeapType ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2," but is not!\n");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2,": ");
        pFVar8 = Fatal::operator<<((Fatal *)local_1b8,
                                   (this->types).
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar3);
        puVar1 = &pFVar8->field_0x10;
        std::operator<<((ostream *)puVar1,"\n");
        std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
        std::operator<<((ostream *)puVar1,": ");
        pFVar8 = Fatal::operator<<(pFVar8,(this->types).
                                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar9);
        Fatal::operator<<(pFVar8,(char (*) [2])0x19daab);
        Fatal::~Fatal((Fatal *)local_1b8);
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void Fuzzer::checkSubtypes() const {
  for (size_t super = 0; super < types.size(); ++super) {
    for (auto sub : subtypeIndices[super]) {
      if (!HeapType::isSubType(types[sub], types[super])) {
        Fatal() << "HeapType " << sub << " should be a subtype of HeapType "
                << super << " but is not!\n"
                << sub << ": " << types[sub] << "\n"
                << super << ": " << types[super] << "\n";
      }
    }
  }
}